

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_set_complexity(REF_DBL *metric,REF_GRID ref_grid,REF_DBL target_complexity)

{
  uint uVar1;
  long lVar2;
  double dVar3;
  REF_NODE local_68;
  double local_58;
  double dStack_48;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL complexity_scale;
  REF_DBL current_complexity;
  REF_INT node;
  REF_INT i;
  REF_NODE ref_node;
  REF_DBL target_complexity_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  _node = ref_grid->node;
  dStack_48 = 0.6666666666666666;
  if (ref_grid->twod != 0) {
    dStack_48 = 1.0;
  }
  ref_node = (REF_NODE)target_complexity;
  target_complexity_local = (REF_DBL)ref_grid;
  ref_grid_local = (REF_GRID)metric;
  uVar1 = ref_metric_complexity(metric,ref_grid,&complexity_scale);
  if (uVar1 == 0) {
    if (complexity_scale * 1e+20 <= 0.0) {
      local_58 = -(complexity_scale * 1e+20);
    }
    else {
      local_58 = complexity_scale * 1e+20;
    }
    if ((double)ref_node <= 0.0) {
      local_68 = (REF_NODE)((ulong)ref_node ^ 0x8000000000000000);
    }
    else {
      local_68 = ref_node;
    }
    if ((double)local_68 < local_58) {
      for (current_complexity._0_4_ = 0; current_complexity._0_4_ < _node->max;
          current_complexity._0_4_ = current_complexity._0_4_ + 1) {
        if (((-1 < current_complexity._0_4_) && (current_complexity._0_4_ < _node->max)) &&
           (-1 < _node->global[current_complexity._0_4_])) {
          for (current_complexity._4_4_ = 0; current_complexity._4_4_ < 6;
              current_complexity._4_4_ = current_complexity._4_4_ + 1) {
            dVar3 = pow((double)ref_node / complexity_scale,dStack_48);
            lVar2 = (long)(current_complexity._4_4_ + current_complexity._0_4_ * 6);
            ref_grid_local->cell[lVar2 + -2] =
                 (REF_CELL)(dVar3 * (double)ref_grid_local->cell[lVar2 + -2]);
          }
          if (*(int *)((long)target_complexity_local + 0x108) != 0) {
            ref_grid_local->cell[(long)(current_complexity._0_4_ * 6 + 2) + -2] = (REF_CELL)0x0;
            ref_grid_local->cell[(long)(current_complexity._0_4_ * 6 + 4) + -2] = (REF_CELL)0x0;
            ref_grid_local->cell[(long)(current_complexity._0_4_ * 6 + 5) + -2] =
                 (REF_CELL)0x3ff0000000000000;
          }
        }
      }
      metric_local._4_4_ = 0;
    }
    else {
      metric_local._4_4_ = 4;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x7c8,
           "ref_metric_set_complexity",(ulong)uVar1,"cmp");
    metric_local._4_4_ = uVar1;
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_set_complexity(REF_DBL *metric, REF_GRID ref_grid,
                                             REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;

  complexity_scale = 2.0 / 3.0;
  if (ref_grid_twod(ref_grid)) {
    complexity_scale = 1.0;
  }

  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(target_complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(target_complexity / current_complexity, complexity_scale);
    }
    if (ref_grid_twod(ref_grid)) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  return REF_SUCCESS;
}